

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.cpp
# Opt level: O2

void __thiscall DragonParser::LexerNamespace::Word::~Word(Word *this)

{
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Word_00109b10;
  (this->lexme)._M_string_length = 0;
  *(this->lexme)._M_dataplus._M_p = '\0';
  std::__cxx11::string::~string((string *)&this->lexme);
  return;
}

Assistant:

Word::~Word()
    {
        Token::~Token();
        lexme.clear();
    }